

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> *
deqp::gles31::bb::anon_unknown_11::mapBuffers
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Functions *gl,
          vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
          *buffers,deUint32 access)

{
  GLenum err;
  pointer pBVar1;
  void *pvVar2;
  TestError *this;
  long lVar3;
  allocator_type local_39;
  value_type local_38;
  
  local_38 = (value_type)0x0;
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (__return_storage_ptr__,
             (long)(buffers->
                   super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(buffers->
                   super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_39);
  pBVar1 = (buffers->
           super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(buffers->
                              super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3)) {
    lVar3 = 0;
    do {
      if (pBVar1[lVar3].size < 1) {
        (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar3] = (void *)0x0;
      }
      else {
        (*gl->bindBuffer)(0x90d2,pBVar1[lVar3].buffer);
        pvVar2 = (*gl->mapBufferRange)
                           (0x90d2,0,(long)(buffers->
                                           super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                                           )._M_impl.super__Vector_impl_data._M_start[lVar3].size,
                            access);
        (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar3] = pvVar2;
        err = (*gl->getError)();
        glu::checkError(err,"Failed to map buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                        ,0x7c6);
        if ((__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar3] == (void *)0x0) {
          this = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this,(char *)0x0,"mapPtrs[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                     ,0x7c7);
          __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      lVar3 = lVar3 + 1;
      pBVar1 = (buffers->
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(buffers->
                                         super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1)
                          >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<void*> mapBuffers (const glw::Functions& gl, const vector<Buffer>& buffers, deUint32 access)
{
	vector<void*> mapPtrs(buffers.size(), DE_NULL);

	try
	{
		for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
		{
			if (buffers[ndx].size > 0)
			{
				gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
				mapPtrs[ndx] = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, buffers[ndx].size, access);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to map buffer");
				TCU_CHECK(mapPtrs[ndx]);
			}
			else
				mapPtrs[ndx] = DE_NULL;
		}

		return mapPtrs;
	}
	catch (...)
	{
		for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
		{
			if (mapPtrs[ndx])
			{
				gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
				gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
			}
		}

		throw;
	}
}